

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xref.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference this;
  longlong lVar4;
  exception *e;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  QPDF local_20 [8];
  QPDF qpdf;
  char **argv_local;
  int argc_local;
  
  _qpdf = argv;
  if (argc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage: test_xref INPUT.pdf");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  QPDF::QPDF(local_20);
  QPDF::processFile((char *)local_20,_qpdf[1]);
  QPDF::getXRefTable();
  __end1 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::begin((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    *)&__begin1);
  iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                *)&__begin1);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) {
      std::
      map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
      ::~map((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              *)&__begin1);
      QPDF::~QPDF(local_20);
      return 0;
    }
    this = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*(&__end1);
    iVar2 = QPDFObjGen::getObj(&this->first);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    poVar3 = std::operator<<(poVar3,"/");
    iVar2 = QPDFObjGen::getGen(&this->first);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,", ");
    iVar2 = QPDFXRefEntry::getType();
    if (iVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"free entry");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else if (iVar2 == 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"uncompressed, offset = ");
      lVar4 = QPDFXRefEntry::getOffset();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar4);
      poVar3 = std::operator<<(poVar3," (0x");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      lVar4 = QPDFXRefEntry::getOffset();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar4);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (iVar2 != 2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"unknown");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        exit(2);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"compressed, stream number = ");
      iVar2 = QPDFXRefEntry::getObjStreamNumber();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3,", stream index = ");
      iVar2 = QPDFXRefEntry::getObjStreamIndex();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "usage: test_xref INPUT.pdf" << std::endl;
        std::exit(2);
    }

    try {
        QPDF qpdf;
        qpdf.processFile(argv[1]);

        for (auto const& iter: qpdf.getXRefTable()) {
            std::cout << iter.first.getObj() << "/" << iter.first.getGen() << ", ";
            switch (iter.second.getType()) {
            case 0:
                std::cout << "free entry" << std::endl;
                break;
            case 1:
                std::cout << "uncompressed, offset = " << iter.second.getOffset() << " (0x"
                          << std::hex << iter.second.getOffset() << std::dec << ")" << std::endl;
                break;
            case 2:
                std::cout << "compressed, stream number = " << iter.second.getObjStreamNumber()
                          << ", stream index = " << iter.second.getObjStreamIndex() << std::endl;
                break;
            default:
                std::cerr << "unknown" << std::endl;
                std::exit(2);
            }
        }
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        std::exit(2);
    }

    return 0;
}